

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall
wasm::Wasm2JSBuilder::Wasm2JSBuilder(Wasm2JSBuilder *this,Flags *f,PassOptions *options_)

{
  __node_base_ptr *pp_Var1;
  __node_base_ptr *pp_Var2;
  long lVar3;
  
  (this->dataIndices)._M_h._M_buckets = &(this->dataIndices)._M_h._M_single_bucket;
  (this->dataIndices)._M_h._M_bucket_count = 1;
  (this->dataIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dataIndices)._M_h._M_element_count = 0;
  (this->dataIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dataIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dataIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Flags::Flags(&this->flags,f);
  PassOptions::PassOptions(&this->options,options_);
  (this->frees).
  super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frees).
  super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frees).
  super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var1 = &this->wasmNameToMangledName[0]._M_h._M_single_bucket;
  lVar3 = 0xe0;
  do {
    ((_Hashtable *)(pp_Var1 + -6))->_M_buckets = pp_Var1;
    pp_Var1[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var1 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var1[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var1 + -2))->_M_max_load_factor = 1.0;
    pp_Var1[-1] = (__node_base_ptr)0x0;
    *pp_Var1 = (__node_base_ptr)0x0;
    pp_Var1 = pp_Var1 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  pp_Var2 = &this->mangledNames[0]._M_h._M_single_bucket;
  lVar3 = 0xe0;
  do {
    ((_Hashtable *)(pp_Var2 + -6))->_M_buckets = pp_Var2;
    pp_Var2[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var2 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var2[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var2 + -2))->_M_max_load_factor = 1.0;
    pp_Var2[-1] = (__node_base_ptr)0x0;
    *pp_Var2 = (__node_base_ptr)0x0;
    pp_Var2 = pp_Var2 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  (this->seenModuleImports)._M_h._M_buckets = &(this->seenModuleImports)._M_h._M_single_bucket;
  (this->seenModuleImports)._M_h._M_bucket_count = 1;
  (this->seenModuleImports)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->seenModuleImports)._M_h._M_element_count = 0;
  (this->seenModuleImports)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->seenModuleImports)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->seenModuleImports)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->functionsCallableFromOutside)._M_h._M_buckets =
       &(this->functionsCallableFromOutside)._M_h._M_single_bucket;
  (this->functionsCallableFromOutside)._M_h._M_bucket_count = 1;
  (this->functionsCallableFromOutside)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functionsCallableFromOutside)._M_h._M_element_count = 0;
  (this->functionsCallableFromOutside)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functionsCallableFromOutside)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functionsCallableFromOutside)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (0 < (this->options).optimizeLevel) {
    (this->options).ignoreImplicitTraps = true;
    (this->options).targetJS = true;
  }
  return;
}

Assistant:

Wasm2JSBuilder(Flags f, PassOptions options_) : flags(f), options(options_) {
    // We don't try to model wasm's trapping precisely - if we did, each load
    // and store would need to do a check. Given that, we can just ignore
    // implicit traps like those when optimizing. (When not optimizing, it's
    // nice to see codegen that matches wasm more precisely.)
    // It is also important to prevent the optimizer from adding new things that
    // require additional lowering, as we could hit a cycle.
    if (options.optimizeLevel > 0) {
      options.ignoreImplicitTraps = true;
      options.targetJS = true;
    }
  }